

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeRange.cpp
# Opt level: O0

bool FIX::TimeRange::isInRange
               (DateTime *startTime,DateTime *endTime,int startDay,int endDay,DateTime *time)

{
  bool bVar1;
  int day;
  DateTime *time_local;
  int endDay_local;
  int startDay_local;
  DateTime *endTime_local;
  DateTime *startTime_local;
  
  day = DateTime::getWeekDay(time);
  bVar1 = isInRange(startTime,endTime,startDay,endDay,time,day);
  return bVar1;
}

Assistant:

bool TimeRange::isInRange( const DateTime& startTime,
                             const DateTime& endTime,
                             int startDay,
                             int endDay,
               const DateTime& time ) 
  {
    return isInRange( startTime, endTime, startDay, endDay, time, time.getWeekDay() );
  }